

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveLright(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *vec,int *ridx,int *rn,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *eps)

{
  uint *puVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  int iVar8;
  cpp_dec_float<50U,_int,_void> *pcVar9;
  cpp_dec_float<50U,_int,_void> *pcVar10;
  int *piVar11;
  cpp_dec_float<50U,_int,_void> *pcVar12;
  ulong uVar13;
  ulong uVar14;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  undefined1 local_238 [16];
  uint local_228 [3];
  undefined3 uStack_21b;
  uint local_218 [3];
  bool local_20c;
  undefined8 local_208;
  ulong local_200;
  ulong local_1f8;
  ulong local_1f0;
  cpp_dec_float<50U,_int,_void> local_1e8;
  int *local_1a8;
  pointer local_1a0;
  int *local_198;
  int *local_190;
  int *local_188;
  int *local_180;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_178;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_170;
  cpp_dec_float<50U,_int,_void> local_168;
  cpp_dec_float<50U,_int,_void> local_128;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_1e8.fpclass = cpp_dec_float_finite;
  local_1e8.prec_elem = 10;
  local_1e8.data._M_elems[0] = 0;
  local_1e8.data._M_elems[1] = 0;
  local_1e8.data._M_elems[2] = 0;
  local_1e8.data._M_elems[3] = 0;
  local_1e8.data._M_elems[4] = 0;
  local_1e8.data._M_elems[5] = 0;
  local_1e8.data._M_elems._24_5_ = 0;
  local_1e8.data._M_elems[7]._1_3_ = 0;
  local_1e8.data._M_elems[8] = 0;
  local_1e8.data._M_elems[9] = 0;
  local_1e8.exp = 0;
  local_1e8.neg = false;
  local_1a0 = (this->l).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_1a8 = (this->l).idx;
  local_180 = (this->l).row;
  local_198 = (this->l).start;
  local_200 = (ulong)(this->l).firstUpdate;
  local_190 = ridx;
  local_188 = rn;
  local_178 = eps;
  if ((long)local_200 < 1) {
    local_200 = 0;
  }
  else {
    local_1f8 = 0;
    local_170 = this;
    do {
      iVar6 = local_180[local_1f8];
      local_1e8.data._M_elems._32_8_ = *(undefined8 *)(vec[iVar6].m_backend.data._M_elems + 8);
      local_1e8.data._M_elems._0_8_ = *(undefined8 *)vec[iVar6].m_backend.data._M_elems;
      local_1e8.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar6].m_backend.data._M_elems + 2);
      puVar1 = vec[iVar6].m_backend.data._M_elems + 4;
      local_1e8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      local_1e8.data._M_elems._24_5_ = SUB85(uVar3,0);
      local_1e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_218[2] = vec[iVar6].m_backend.exp;
      local_1e8.neg = vec[iVar6].m_backend.neg;
      local_1e8.fpclass = vec[iVar6].m_backend.fpclass;
      local_1e8.prec_elem = vec[iVar6].m_backend.prec_elem;
      local_218._0_8_ = *(undefined8 *)(vec[iVar6].m_backend.data._M_elems + 8);
      puVar1 = vec[iVar6].m_backend.data._M_elems + 4;
      local_228._0_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      stack0xfffffffffffffde0 = (undefined5)uVar3;
      uStack_21b = (undefined3)((ulong)uVar3 >> 0x28);
      local_68.data._M_elems._0_8_ = *(undefined8 *)(local_178->m_backend).data._M_elems;
      local_68.data._M_elems._8_8_ = *(undefined8 *)((local_178->m_backend).data._M_elems + 2);
      local_68.data._M_elems._16_8_ = *(undefined8 *)((local_178->m_backend).data._M_elems + 4);
      local_68.data._M_elems._24_8_ = *(undefined8 *)((local_178->m_backend).data._M_elems + 6);
      local_68.data._M_elems._32_8_ = *(undefined8 *)((local_178->m_backend).data._M_elems + 8);
      local_68.exp = (local_178->m_backend).exp;
      local_68.neg = (local_178->m_backend).neg;
      local_68.fpclass = (local_178->m_backend).fpclass;
      local_68.prec_elem = (local_178->m_backend).prec_elem;
      local_208._4_4_ = local_1e8.prec_elem;
      local_208._0_4_ = local_1e8.fpclass;
      local_20c = local_1e8.neg;
      if ((local_1e8.neg == true) &&
         (local_238._0_4_ = (undefined4)*(undefined8 *)vec[iVar6].m_backend.data._M_elems,
         local_238._0_4_ != 0 || local_1e8.fpclass != cpp_dec_float_finite)) {
        local_20c = false;
      }
      local_1e8.exp = local_218[2];
      if ((local_68.fpclass != cpp_dec_float_NaN && local_1e8.fpclass != cpp_dec_float_NaN) &&
         (local_238 = *(undefined1 (*) [16])vec[iVar6].m_backend.data._M_elems,
         iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           ((cpp_dec_float<50U,_int,_void> *)local_238,&local_68), 0 < iVar6)) {
        local_1f0 = (ulong)local_198[local_1f8];
        iVar6 = local_198[local_1f8 + 1];
        if (local_198[local_1f8] < iVar6) {
          pcVar12 = &local_1a0[local_1f0].m_backend;
          piVar11 = local_1a8 + local_1f0;
          do {
            iVar8 = *piVar11;
            local_168.fpclass = cpp_dec_float_finite;
            local_168.prec_elem = 10;
            local_168.data._M_elems[0] = 0;
            local_168.data._M_elems[1] = 0;
            local_168.data._M_elems[2] = 0;
            local_168.data._M_elems[3] = 0;
            local_168.data._M_elems[4] = 0;
            local_168.data._M_elems[5] = 0;
            local_168.data._M_elems._24_5_ = 0;
            local_168.data._M_elems[7]._1_3_ = 0;
            local_168.data._M_elems[8] = 0;
            local_168.data._M_elems[9] = 0;
            local_168.exp = 0;
            local_168.neg = false;
            pcVar10 = &local_1e8;
            if (pcVar12 != &local_168) {
              local_168.data._M_elems[8] = local_1e8.data._M_elems[8];
              local_168.data._M_elems[9] = local_1e8.data._M_elems[9];
              local_168.data._M_elems[4] = local_1e8.data._M_elems[4];
              local_168.data._M_elems[5] = local_1e8.data._M_elems[5];
              local_168.data._M_elems._24_5_ = local_1e8.data._M_elems._24_5_;
              local_168.data._M_elems[7]._1_3_ = local_1e8.data._M_elems[7]._1_3_;
              local_168.data._M_elems[2] = local_1e8.data._M_elems[2];
              local_168.data._M_elems[3] = local_1e8.data._M_elems[3];
              local_168.data._M_elems[0] = local_1e8.data._M_elems[0];
              local_168.data._M_elems[1] = local_1e8.data._M_elems[1];
              local_168.exp = local_1e8.exp;
              local_168.neg = local_1e8.neg;
              local_168.fpclass = local_1e8.fpclass;
              local_168.prec_elem = local_1e8.prec_elem;
              pcVar10 = pcVar12;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_168,pcVar10);
            pcVar10 = &vec[iVar8].m_backend;
            if (vec[iVar8].m_backend.fpclass != cpp_dec_float_NaN) {
              local_208._0_4_ = cpp_dec_float_finite;
              local_208._4_4_ = 10;
              local_238 = (undefined1  [16])0x0;
              local_228[0] = 0;
              local_228[1] = 0;
              stack0xfffffffffffffde0 = 0;
              uStack_21b = 0;
              local_218[0] = 0;
              local_218[1] = 0;
              local_218[2] = 0;
              local_20c = false;
              pcVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
              local_238 = *(undefined1 (*) [16])(pcVar9->data)._M_elems;
              local_228._0_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 4);
              uVar3 = *(undefined8 *)((pcVar9->data)._M_elems + 6);
              stack0xfffffffffffffde0 = (undefined5)uVar3;
              uStack_21b = (undefined3)((ulong)uVar3 >> 0x28);
              local_218._0_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 8);
              local_218[2] = pcVar9->exp;
              local_20c = pcVar9->neg;
              local_208._0_4_ = pcVar9->fpclass;
              local_208._4_4_ = pcVar9->prec_elem;
              iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (pcVar10,(cpp_dec_float<50U,_int,_void> *)local_238);
              if (iVar7 == 0) {
                local_190[*local_188] = iVar8;
                *local_188 = *local_188 + 1;
              }
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (pcVar10,&local_168);
            if (pcVar10->fpclass != cpp_dec_float_NaN) {
              local_208._0_4_ = cpp_dec_float_finite;
              local_208._4_4_ = 10;
              local_238 = (undefined1  [16])0x0;
              local_228[0] = 0;
              local_228[1] = 0;
              stack0xfffffffffffffde0 = 0;
              uStack_21b = 0;
              local_218[0] = 0;
              local_218[1] = 0;
              local_218[2] = 0;
              local_20c = false;
              pcVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
              local_238 = *(undefined1 (*) [16])(pcVar9->data)._M_elems;
              local_228._0_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 4);
              uVar3 = *(undefined8 *)((pcVar9->data)._M_elems + 6);
              stack0xfffffffffffffde0 = (undefined5)uVar3;
              uStack_21b = (undefined3)((ulong)uVar3 >> 0x28);
              local_218._0_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 8);
              local_218[2] = pcVar9->exp;
              local_20c = pcVar9->neg;
              local_208._0_4_ = pcVar9->fpclass;
              local_208._4_4_ = pcVar9->prec_elem;
              iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (pcVar10,(cpp_dec_float<50U,_int,_void> *)local_238);
              if (iVar8 == 0) {
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)pcVar10,1e-100);
              }
            }
            piVar11 = piVar11 + 1;
            pcVar12 = pcVar12 + 1;
            iVar6 = iVar6 + -1;
          } while ((int)local_1f0 < iVar6);
        }
      }
      local_1f8 = local_1f8 + 1;
      this = local_170;
    } while (local_1f8 != local_200);
  }
  if ((this->l).updateType != 0) {
    uVar2 = (this->l).firstUnused;
    uVar14 = (ulong)uVar2;
    if ((int)local_200 < (int)uVar2) {
      uVar13 = local_200 & 0xffffffff;
      local_1f8 = uVar14;
      do {
        iVar6 = local_198[uVar13];
        local_128.fpclass = cpp_dec_float_finite;
        local_128.prec_elem = 10;
        local_128.data._M_elems[0] = 0;
        local_128.data._M_elems[1] = 0;
        local_128.data._M_elems[2] = 0;
        local_128.data._M_elems[3] = 0;
        local_128.data._M_elems[4] = 0;
        local_128.data._M_elems[5] = 0;
        local_128.data._M_elems._24_5_ = 0;
        local_128.data._M_elems[7]._1_3_ = 0;
        local_128.data._M_elems[8] = 0;
        local_128.data._M_elems[9] = 0;
        local_128.exp = 0;
        local_128.neg = false;
        iVar8 = local_198[uVar13 + 1];
        if (iVar6 < iVar8) {
          pcVar12 = &local_1a0[iVar6].m_backend;
          piVar11 = local_1a8 + iVar6;
          local_1f0 = uVar13;
          do {
            pcVar9 = &vec[*piVar11].m_backend;
            local_208._0_4_ = cpp_dec_float_finite;
            local_208._4_4_ = 10;
            local_238 = (undefined1  [16])0x0;
            local_228[0] = 0;
            local_228[1] = 0;
            stack0xfffffffffffffde0 = 0;
            uStack_21b = 0;
            local_218[0] = 0;
            local_218[1] = 0;
            local_218[2] = 0;
            local_20c = false;
            pcVar10 = pcVar9;
            if ((pcVar12 != (cpp_dec_float<50U,_int,_void> *)local_238) &&
               (pcVar10 = pcVar12, (cpp_dec_float<50U,_int,_void> *)local_238 != pcVar9)) {
              local_218._0_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<50U,_int,_void> *)&pcVar9->data)->data)._M_elems + 8);
              local_238 = *(undefined1 (*) [16])
                           (((cpp_dec_float<50U,_int,_void> *)&pcVar9->data)->data)._M_elems;
              local_228._0_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<50U,_int,_void> *)&pcVar9->data)->data)._M_elems + 4);
              uVar3 = *(undefined8 *)
                       ((((cpp_dec_float<50U,_int,_void> *)&pcVar9->data)->data)._M_elems + 6);
              stack0xfffffffffffffde0 = (undefined5)uVar3;
              uStack_21b = (undefined3)((ulong)uVar3 >> 0x28);
              local_218[2] = pcVar9->exp;
              local_20c = pcVar9->neg;
              local_208._0_4_ = pcVar9->fpclass;
              local_208._4_4_ = pcVar9->prec_elem;
            }
            piVar11 = piVar11 + 1;
            pcVar12 = pcVar12 + 1;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      ((cpp_dec_float<50U,_int,_void> *)local_238,pcVar10);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_128,(cpp_dec_float<50U,_int,_void> *)local_238);
            iVar8 = iVar8 + -1;
          } while (iVar6 < iVar8);
          uVar13 = local_1f0;
          uVar14 = local_1f8;
          local_1e8.fpclass = local_128.fpclass;
          local_1e8.prec_elem = local_128.prec_elem;
        }
        else {
          local_1e8.fpclass = cpp_dec_float_finite;
          local_1e8.prec_elem = 10;
        }
        auVar5 = (undefined1  [16])local_128.data._M_elems._0_16_;
        iVar6 = local_180[uVar13];
        local_1e8.data._M_elems[8] = local_128.data._M_elems[8];
        local_1e8.data._M_elems[9] = local_128.data._M_elems[9];
        local_1e8.data._M_elems[4] = local_128.data._M_elems[4];
        local_1e8.data._M_elems[5] = local_128.data._M_elems[5];
        local_1e8.data._M_elems._24_5_ = local_128.data._M_elems._24_5_;
        local_1e8.data._M_elems[7]._1_3_ = local_128.data._M_elems[7]._1_3_;
        local_1e8.data._M_elems[0] = local_128.data._M_elems[0];
        local_1e8.data._M_elems[1] = local_128.data._M_elems[1];
        uVar3 = local_1e8.data._M_elems._0_8_;
        local_1e8.data._M_elems[0] = local_128.data._M_elems[0];
        local_1e8.data._M_elems[1] = local_128.data._M_elems[1];
        local_1e8.data._M_elems[2] = local_128.data._M_elems[2];
        local_1e8.data._M_elems[3] = local_128.data._M_elems[3];
        local_218[0] = local_128.data._M_elems[8];
        local_218[1] = local_128.data._M_elems[9];
        local_228[0] = local_128.data._M_elems[4];
        local_228[1] = local_128.data._M_elems[5];
        stack0xfffffffffffffde0 = local_128.data._M_elems._24_5_;
        uStack_21b = local_128.data._M_elems[7]._1_3_;
        local_128.data._M_elems[0] = auVar5._0_4_;
        local_128.data._M_elems[1] = auVar5._4_4_;
        local_128.data._M_elems[2] = auVar5._8_4_;
        local_128.data._M_elems[3] = auVar5._12_4_;
        local_238._0_4_ = local_128.data._M_elems[0];
        local_238._4_4_ = local_128.data._M_elems[1];
        local_238._8_4_ = local_128.data._M_elems[2];
        local_238._12_4_ = local_128.data._M_elems[3];
        auVar4 = local_238;
        local_a8.data._M_elems._0_8_ = *(undefined8 *)(local_178->m_backend).data._M_elems;
        local_a8.data._M_elems._8_8_ = *(undefined8 *)((local_178->m_backend).data._M_elems + 2);
        local_a8.data._M_elems._16_8_ = *(undefined8 *)((local_178->m_backend).data._M_elems + 4);
        local_a8.data._M_elems._24_8_ = *(undefined8 *)((local_178->m_backend).data._M_elems + 6);
        local_a8.data._M_elems._32_8_ = *(undefined8 *)((local_178->m_backend).data._M_elems + 8);
        local_a8.exp = (local_178->m_backend).exp;
        local_a8.neg = (local_178->m_backend).neg;
        local_a8.fpclass = (local_178->m_backend).fpclass;
        local_a8.prec_elem = (local_178->m_backend).prec_elem;
        local_208._4_4_ = local_1e8.prec_elem;
        local_208._0_4_ = local_1e8.fpclass;
        local_20c = local_128.neg;
        if (((local_128.neg & 1U) != 0) &&
           (local_238._0_4_ = auVar5._0_4_,
           local_238._0_4_ != 0 || local_1e8.fpclass != cpp_dec_float_finite)) {
          local_20c = (bool)(local_128.neg ^ 1);
        }
        local_1e8.exp = local_128.exp;
        local_1e8.neg = local_128.neg;
        if ((local_a8.fpclass != cpp_dec_float_NaN && local_1e8.fpclass != cpp_dec_float_NaN) &&
           (local_238 = auVar4, local_218[2] = local_128.exp,
           local_128.data._M_elems._0_16_ = auVar5,
           iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)local_238,&local_a8),
           uVar3 = local_1e8.data._M_elems._0_8_, 0 < iVar8)) {
          local_e8.data._M_elems[8] = local_1e8.data._M_elems[8];
          local_e8.data._M_elems[9] = local_1e8.data._M_elems[9];
          local_e8.data._M_elems[7]._1_3_ = local_1e8.data._M_elems[7]._1_3_;
          local_e8.data._M_elems._24_5_ = local_1e8.data._M_elems._24_5_;
          local_e8.data._M_elems[4] = local_1e8.data._M_elems[4];
          local_e8.data._M_elems[5] = local_1e8.data._M_elems[5];
          local_e8.data._M_elems[0] = local_1e8.data._M_elems[0];
          local_e8.data._M_elems[1] = local_1e8.data._M_elems[1];
          local_e8.data._M_elems[2] = local_1e8.data._M_elems[2];
          local_e8.data._M_elems[3] = local_1e8.data._M_elems[3];
          local_e8.exp = local_1e8.exp;
          local_e8.neg = local_1e8.neg;
          local_e8.fpclass = local_1e8.fpclass;
          local_e8.prec_elem = local_1e8.prec_elem;
          pcVar12 = &vec[iVar6].m_backend;
          if (vec[iVar6].m_backend.fpclass != cpp_dec_float_NaN) {
            local_208._0_4_ = cpp_dec_float_finite;
            local_208._4_4_ = 10;
            local_238 = (undefined1  [16])0x0;
            local_228[0] = 0;
            local_228[1] = 0;
            stack0xfffffffffffffde0 = 0;
            uStack_21b = 0;
            local_218[0] = 0;
            local_218[1] = 0;
            local_218[2] = 0;
            local_20c = false;
            pcVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
            local_238 = *(undefined1 (*) [16])(pcVar10->data)._M_elems;
            local_228._0_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 4);
            uVar3 = *(undefined8 *)((pcVar10->data)._M_elems + 6);
            stack0xfffffffffffffde0 = (undefined5)uVar3;
            uStack_21b = (undefined3)((ulong)uVar3 >> 0x28);
            local_218._0_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 8);
            local_218[2] = pcVar10->exp;
            local_20c = pcVar10->neg;
            local_208._0_4_ = pcVar10->fpclass;
            local_208._4_4_ = pcVar10->prec_elem;
            iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (pcVar12,(cpp_dec_float<50U,_int,_void> *)local_238);
            if (iVar8 == 0) {
              local_190[*local_188] = iVar6;
              *local_188 = *local_188 + 1;
            }
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (pcVar12,&local_e8);
          uVar3 = local_1e8.data._M_elems._0_8_;
          if (pcVar12->fpclass != cpp_dec_float_NaN) {
            local_208._0_4_ = cpp_dec_float_finite;
            local_208._4_4_ = 10;
            local_238 = (undefined1  [16])0x0;
            local_228[0] = 0;
            local_228[1] = 0;
            stack0xfffffffffffffde0 = 0;
            uStack_21b = 0;
            local_218[0] = 0;
            local_218[1] = 0;
            local_218[2] = 0;
            local_20c = false;
            pcVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
            local_238 = *(undefined1 (*) [16])(pcVar10->data)._M_elems;
            local_228._0_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 4);
            uVar3 = *(undefined8 *)((pcVar10->data)._M_elems + 6);
            stack0xfffffffffffffde0 = (undefined5)uVar3;
            uStack_21b = (undefined3)((ulong)uVar3 >> 0x28);
            local_218._0_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 8);
            local_218[2] = pcVar10->exp;
            local_20c = pcVar10->neg;
            local_208._0_4_ = pcVar10->fpclass;
            local_208._4_4_ = pcVar10->prec_elem;
            iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (pcVar12,(cpp_dec_float<50U,_int,_void> *)local_238);
            uVar3 = local_1e8.data._M_elems._0_8_;
            if (iVar6 == 0) {
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)pcVar12,1e-100);
              uVar3 = local_1e8.data._M_elems._0_8_;
            }
          }
        }
        local_1e8.data._M_elems._0_8_ = uVar3;
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar14);
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveLright(R* vec, int* ridx, int& rn, R eps)
{
   int i, j, k, n;
   int end;
   R x;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   // loop through columns of L
   for(i = 0; i < end; ++i)
   {
      x = vec[lrow[i]];

      // check whether there is a corresponding value in the rhs VectorBase<R>; skipping/ignoring FACTOR_MARKER
      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         // apply \f$- x * L_{k,i}\f$ to all corresponding values in rhs/solution VectorBase<R>
         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            n = *idx++;
            updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
            ++val;
         }
      }
   }

   if(l.updateType)                     /* Forest-Tomlin Updates */
   {
      end = l.firstUnused;

      for(; i < end; ++i)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         StableSum<R> tmp;

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            tmp += vec[*idx++] * (*val++);
         }

         j = lrow[i];
         x = R(tmp);

         if(isNotZero(x, eps))
            updateSolutionVectorLright(x, j, vec[j], ridx, rn);
      }
   }
}